

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O1

long c_scan(long num,long degree,long res)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long local_50;
  
  if (3 < (ulong)num) {
    __assert_fail("num >= 0 && num <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                  ,0x1a,"long c_scan(long, long, long)");
  }
  uVar10 = 10;
  if (res < 10) {
    uVar10 = res;
  }
  if ((long)uVar10 < 1) {
    uVar10 = 0;
  }
  uVar7 = -degree;
  if (0 < degree) {
    uVar7 = degree;
  }
  uVar8 = uVar7 % 0x168;
  if (uVar7 < 0x168) {
    uVar8 = uVar7;
  }
  bVar14 = uVar8 < 0x168 - uVar10;
  uVar7 = uVar8 + 0xb4;
  if (bVar14 && uVar10 < uVar8) {
    uVar7 = uVar8;
  }
  robots[num].scan = (int)uVar8;
  piVar13 = &robots[0].y;
  uVar12 = 0;
  local_50 = 0;
  do {
    if ((num != uVar12) && (((robot *)(piVar13 + -6))->status != 0)) {
      iVar1 = robots[num].x;
      iVar2 = piVar13[-1];
      iVar3 = (int)((ulong)((long)iVar2 * -0x66666667) >> 0x20);
      iVar6 = ((iVar3 >> 2) - (iVar3 >> 0x1f)) + iVar1 / 10;
      fVar17 = (float)iVar6;
      iVar3 = robots[num].y;
      iVar4 = *piVar13;
      iVar5 = (int)((ulong)((long)iVar4 * -0x66666667) >> 0x20);
      fVar18 = (float)(((iVar5 >> 2) - (iVar5 >> 0x1f)) + iVar3 / 10);
      if ((int)((double)iVar6 + 0.5) == 0) {
        lVar11 = 0x10e;
        if (iVar3 < iVar4) {
          lVar11 = 0x5a;
        }
      }
      else {
        fVar16 = atanf(fVar18 / fVar17);
        if (iVar4 < iVar3) {
          if (iVar1 < iVar2) {
            fVar16 = fVar16 * 57.29578 + 360.0;
          }
          else {
LAB_00136415:
            fVar16 = fVar16 * 57.29578 + 180.0;
          }
        }
        else {
          if (iVar2 <= iVar1) goto LAB_00136415;
          fVar16 = fVar16 * 57.29578;
        }
        lVar11 = (long)fVar16;
      }
      lVar9 = lVar11 + 0xb4;
      if (bVar14 && uVar10 < uVar8) {
        lVar9 = lVar11;
      }
      if (r_debug != 0) {
        printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",uVar8,lVar9 - uVar10,
               uVar10 + lVar9,uVar12 & 0xffffffff);
      }
      if (((long)(lVar9 - uVar10) <= (long)uVar7) && ((long)uVar7 <= (long)(uVar10 + lVar9))) {
        fVar17 = fVar17 * fVar17 + fVar18 * fVar18;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        lVar11 = local_50;
        if (fVar17 < (float)local_50) {
          lVar11 = (long)fVar17;
        }
        bVar15 = local_50 == 0;
        local_50 = lVar11;
        if (bVar15) {
          local_50 = (long)fVar17;
        }
      }
    }
    uVar12 = uVar12 + 1;
    piVar13 = piVar13 + 0x2e;
    if (uVar12 == 4) {
      return local_50;
    }
  } while( true );
}

Assistant:

long c_scan(long num, long degree, long res)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  int i;

  float distance;
  long close_dist = 0L;
  float x, y;
  long d, dd, d1, d2;

  /* get degree of scan resolution, up to limit */
  // res = pop();
  if (res < 0L)
    res = 0L;
  else if (res > RES_LIMIT)
    res = RES_LIMIT;

  /* get scan direction */
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  cur_robot->scan = (int)degree; /* record scan for display */

  /* check other robots for +/- resolution */
  for (i = 0; i < MAXROBOTS; i++)
  {
    if (cur_robot == &robots[i] || robots[i].status == DEAD)
      continue; /* skip current or dead robots */
    /* find relative degree angle */
    x = (cur_robot->x / CLICK) - (robots[i].x / CLICK);
    y = (cur_robot->y / CLICK) - (robots[i].y / CLICK);
    if ((int)(x + 0.5) == 0)
      /* avoid division by zero */
      d = (robots[i].y > cur_robot->y) ? 90 : 270;
    else
    {
      if (robots[i].y < cur_robot->y)
      {
        if (robots[i].x > cur_robot->x)
          d = 360.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 4 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 3 */
      }
      else
      {
        if (robots[i].x > cur_robot->x)
          d = RAD_DEG * atan(y / x); /* relative quadrant 1 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 2 */
      }
    }

    /* find out if robot tested is within the scan resolution */
    if (degree > res && degree < 360 - res)
    {
      dd = degree;
      d1 = d - res;
      d2 = d + res;
    }
    else
    {
      /* on 0 and 360 boundary, bring back into linear resolution */
      dd = degree + 180;
      d1 = 180 + d - res;
      d2 = 180 + d + res;
    }

    if (r_debug)
      printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",
             degree, d1, d2, i, d);

    if (dd >= d1 && dd <= d2)
    {
      /* this robot is within scan, so get his distance */
      distance = sqrt((x * x) + (y * y));
      /* only get the closest distance, when two or more robots are in scan */
      if (distance < close_dist || close_dist == 0L)
        close_dist = distance;
    }
  }
  return ((long)close_dist);
}